

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::AttributeTranslator::seal(AttributeTranslator *this)

{
  bool bVar1;
  pointer this_00;
  Slice this_01;
  int __fd;
  Slice in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false,_false>,_bool>
  pVar2;
  Slice key;
  ObjectIterator it;
  Slice s;
  Builder *in_stack_ffffffffffffff48;
  unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
  *in_stack_ffffffffffffff50;
  undefined1 useSequentialIteration;
  size_type *__args_1;
  ObjectIterator *in_stack_ffffffffffffff58;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false>
  in_stack_ffffffffffffff68;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff78;
  ObjectIterator local_30;
  uint8_t *local_10;
  
  __fd = 0;
  bVar1 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  useSequentialIteration = (undefined1)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  if (!bVar1) {
    this_00 = std::
              unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
              ::operator->((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                            *)0x1069ea);
    Builder::close(this_00,__fd);
    std::
    unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>::
    operator->((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                *)0x1069fc);
    local_10 = (uint8_t *)Builder::slice(in_stack_ffffffffffffff48);
    ObjectIterator::ObjectIterator(in_stack_ffffffffffffff58,in_RDI,(bool)useSequentialIteration);
    while (bVar1 = ObjectIterator::valid(&local_30), bVar1) {
      ObjectIterator::key((ObjectIterator *)in_stack_ffffffffffffff68._M_cur,
                          SUB81((ulong)in_RDI._start >> 0x38,0));
      __args_1 = &(((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
                     *)in_RDI._start)->_M_h)._M_bucket_count;
      SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                 in_stack_ffffffffffffff68._M_cur);
      ObjectIterator::value((ObjectIterator *)in_stack_ffffffffffffff68._M_cur);
      SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::begin
                ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x106aa1);
      std::
      unordered_map<std::basic_string_view<char,std::char_traits<char>>,unsigned_char_const*,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_char_const*>>>
      ::emplace<std::basic_string_view<char,std::char_traits<char>>,unsigned_char_const*>
                ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
                  *)in_RDI._start,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58,
                 (uchar **)__args_1);
      in_stack_ffffffffffffff58 =
           (ObjectIterator *)
           &(((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
               *)((long)in_RDI._start + 0x38))->_M_h)._M_bucket_count;
      this_01 = ObjectIterator::value((ObjectIterator *)in_stack_ffffffffffffff68._M_cur);
      SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUInt
                (in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff78 =
           (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
           SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::begin
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      0x106aff);
      pVar2 = std::
              unordered_map<unsigned_long,unsigned_char_const*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_char_const*>>>
              ::emplace<unsigned_long,unsigned_char_const*>
                        ((unordered_map<unsigned_long,_const_unsigned_char_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>_>
                          *)in_RDI._start,(unsigned_long *)in_stack_ffffffffffffff58,
                         (uchar **)__args_1);
      in_stack_ffffffffffffff68._M_cur =
           (__node_type *)
           pVar2.first.
           super__Node_iterator_base<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false>.
           _M_cur;
      ObjectIterator::next((ObjectIterator *)this_01._start);
    }
  }
  return;
}

Assistant:

void AttributeTranslator::seal() {
  if (_builder == nullptr) {
    return;
  }

  _builder->close();

  Slice s(_builder->slice());

  ObjectIterator it(s, /*useSequentialIteration*/ true);

  while (it.valid()) {
    Slice key(it.key(false));
    VELOCYPACK_ASSERT(key.isString());

    // insert into string and char lookup maps
    _keyToId.emplace(key.stringView(), it.value().begin());
    // insert into id to slice lookup map
    _idToKey.emplace(it.value().getUInt(), key.begin());
    it.next();
  }
}